

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Configuration.cpp
# Opt level: O0

Configuration * Configuration::i(void)

{
  pointer pCVar1;
  Configuration *in_stack_fffffffffffffff0;
  
  pCVar1 = std::unique_ptr<Configuration,_std::default_delete<Configuration>_>::get
                     ((unique_ptr<Configuration,_std::default_delete<Configuration>_> *)
                      in_stack_fffffffffffffff0);
  if (pCVar1 == (pointer)0x0) {
    pCVar1 = (pointer)operator_new(0xa0);
    Configuration(in_stack_fffffffffffffff0);
    std::unique_ptr<Configuration,_std::default_delete<Configuration>_>::reset
              ((unique_ptr<Configuration,_std::default_delete<Configuration>_> *)
               in_stack_fffffffffffffff0,pCVar1);
  }
  pCVar1 = std::unique_ptr<Configuration,_std::default_delete<Configuration>_>::get
                     ((unique_ptr<Configuration,_std::default_delete<Configuration>_> *)
                      in_stack_fffffffffffffff0);
  return pCVar1;
}

Assistant:

Configuration* Configuration::i()
{
	if (instance.get() == NULL)
	{
		instance.reset(new Configuration());
	}

	return instance.get();
}